

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O2

gbspace_t get_space(uint address)

{
  gbspace_t gVar1;
  
  if (address < 0x4000) {
    return rom_0;
  }
  if (address < 0x8000) {
    gVar1 = rom_n;
  }
  else if (address < 0xa000) {
    gVar1 = vram;
  }
  else if (address < 0xc000) {
    gVar1 = ram;
  }
  else if (address < 0xd000) {
    gVar1 = wram_0;
  }
  else if (address < 0xe000) {
    gVar1 = wram_n;
  }
  else if (address < 0xfe00) {
    gVar1 = echo;
  }
  else if (address < 0xfea0) {
    gVar1 = oam;
  }
  else if (address < 0xff00) {
    gVar1 = unusable;
  }
  else if (address < 0xff80) {
    gVar1 = io;
  }
  else {
    if (0xfffe < address) {
      return (address != 0xffff) + ie;
    }
    gVar1 = hram;
  }
  return gVar1;
}

Assistant:

gbspace_t get_space(unsigned address)
{
    if (address < 0x4000)
        return rom_0;
    if (address < 0x8000)
        return rom_n;
    if (address < 0xA000)
        return vram;
    if (address < 0xC000)
        return ram;
    if (address < 0xD000)
        return wram_0;
    if (address < 0xE000)
        return wram_n;
    if (address < 0xFE00)
        return echo;
    if (address < 0xFEA0)
        return oam;
    if (address < 0xFF00)
        return unusable;
    if (address < 0xFF80)
        return io;
    if (address < 0xFFFF)
        return hram;
    if (address == 0xFFFF)
        return ie;

    return out_of_mmap;
}